

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model-loader.h
# Opt level: O1

bool __thiscall
llama_model_loader::weight_name_comparer::operator()(weight_name_comparer *this,string *a,string *b)

{
  bool bVar1;
  byte extraout_var;
  int b_layer;
  int a_layer;
  int local_30;
  int local_2c;
  
  local_2c = -1;
  local_30 = -1;
  __isoc99_sscanf((a->_M_dataplus)._M_p,"blk.%d.",&local_2c);
  __isoc99_sscanf((b->_M_dataplus)._M_p,"blk.%d.",&local_30);
  if (local_2c == local_30) {
    std::__cxx11::string::compare((string *)a);
    bVar1 = (bool)(extraout_var >> 7);
  }
  else {
    bVar1 = local_2c < local_30;
  }
  return bVar1;
}

Assistant:

bool operator()(const std::string & a, const std::string & b) const {
            int a_layer = -1;
            int b_layer = -1;
            sscanf(a.c_str(), "blk.%d.", &a_layer);
            sscanf(b.c_str(), "blk.%d.", &b_layer);
            if (a_layer != b_layer) {
                return a_layer < b_layer;
            }
            return a < b;
        }